

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

void Sdm_ManPrintDsdStats(Sdm_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint local_1c;
  uint local_18;
  int Absent;
  int i;
  int fVerbose_local;
  Sdm_Man_t *p_local;
  
  local_1c = 0;
  for (local_18 = 0; (int)local_18 < 0x253; local_18 = local_18 + 1) {
    if (p->nCountDsd[(int)local_18] == 0) {
      local_1c = local_1c + 1;
    }
    else if (fVerbose != 0) {
      printf("%5d  :  ",(ulong)local_18);
      printf("%-20s   ",p->pDsd6[(int)local_18].pStr);
      printf("%8d ",(ulong)(uint)p->nCountDsd[(int)local_18]);
      printf("\n");
    }
  }
  printf("Unused classes = %d (%.2f %%).  ",((double)(int)local_1c * 100.0) / 595.0,(ulong)local_1c)
  ;
  uVar1 = p->nNonDsd;
  iVar2 = p->nNonDsd;
  iVar3 = Abc_MaxInt(1,p->nAllDsd);
  printf("Non-DSD cuts = %d (%.2f %%).  ",((double)iVar2 * 100.0) / (double)iVar3,(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void Sdm_ManPrintDsdStats( Sdm_Man_t * p, int fVerbose )
{
    int i, Absent = 0;
    for ( i = 0; i < DSD_CLASS_NUM; i++ )
    {
        if ( p->nCountDsd[i] == 0 )
        {
            Absent++;
            continue;
        }
        if ( fVerbose )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", p->pDsd6[i].pStr );
            printf( "%8d ",     p->nCountDsd[i] );
            printf( "\n" );
        }
    }
    printf( "Unused classes = %d (%.2f %%).  ", Absent, 100.0 * Absent / DSD_CLASS_NUM );
    printf( "Non-DSD cuts = %d (%.2f %%).  ",   p->nNonDsd, 100.0 * p->nNonDsd / Abc_MaxInt(1, p->nAllDsd) );
    printf( "\n" );
}